

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::_build_extra_shape
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,InputGraph *shape,bool injective,int count,bool pattern)

{
  string_view l;
  string_view l_00;
  string_view l_01;
  string_view l_02;
  bool bVar1;
  SVOBitset *in_RCX;
  uint in_EDX;
  allocator<char> *in_RSI;
  char *in_RDI;
  int in_stack_00000008;
  byte in_stack_00000010;
  HomomorphismResult child_result;
  int seen_count;
  HomomorphismParams child_params;
  uint w_1;
  uint v_1;
  uint w;
  value_type nv;
  uint v;
  InputGraph master_graph;
  HomomorphismParams *in_stack_000003d8;
  InputGraph *in_stack_000003e0;
  InputGraph *in_stack_000003e8;
  SVOBitset *in_stack_fffffffffffffc98;
  HomomorphismParams *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint in_stack_fffffffffffffca8;
  uint in_stack_fffffffffffffcac;
  uint in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbc;
  byte bVar2;
  undefined1 in_stack_fffffffffffffcbd;
  undefined1 in_stack_fffffffffffffcbe;
  byte bVar3;
  undefined1 in_stack_fffffffffffffcbf;
  SVOBitset *this_01;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  bool in_stack_fffffffffffffcea;
  bool in_stack_fffffffffffffceb;
  int in_stack_fffffffffffffcec;
  InputGraph *in_stack_fffffffffffffcf0;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_3c;
  
  this_01 = in_RCX;
  __a = in_RSI;
  InputGraph::InputGraph
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffceb,
             in_stack_fffffffffffffcea);
  for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)in_RSI,
               (ulong)(local_3c * *(int *)(in_RDI + 8)));
    SVOBitset::SVOBitset((SVOBitset *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    for (local_d8 = 0; local_d8 < local_3c; local_d8 = local_d8 + 1) {
      in_stack_fffffffffffffcbf =
           SVOBitset::test(this_01,CONCAT13(in_stack_fffffffffffffcbf,
                                            CONCAT12(in_stack_fffffffffffffcbe,
                                                     CONCAT11(in_stack_fffffffffffffcbd,
                                                              in_stack_fffffffffffffcbc))));
      if ((bool)in_stack_fffffffffffffcbf) {
        InputGraph::add_edge
                  ((InputGraph *)in_stack_fffffffffffffce0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
        ;
      }
    }
    SVOBitset::~SVOBitset((SVOBitset *)in_stack_fffffffffffffca0);
  }
  local_dc = 0;
  do {
    bVar3 = 0;
    if (local_dc < in_EDX) {
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14caca);
      std::__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x14cad2);
      in_stack_fffffffffffffcbd = Timeout::should_abort((Timeout *)0x14cada);
      bVar3 = in_stack_fffffffffffffcbd ^ 0xff;
    }
    if ((bVar3 & 1) == 0) {
      if ((in_stack_00000010 & 1) != 0) {
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x14ceda);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffce7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffce0,in_RDI,__a);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                    (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
        std::__cxx11::string::~string(this_00);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffce7);
      }
      *(int *)&in_RCX->_data = *(int *)&in_RCX->_data + 1;
      InputGraph::~InputGraph((InputGraph *)0x14cf8d);
      return;
    }
    local_e0 = 0;
    while( true ) {
      bVar2 = 0;
      if (local_e0 < local_dc) {
        std::
        unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      *)0x14cb22);
        std::__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x14cb2a);
        bVar1 = Timeout::should_abort((Timeout *)0x14cb32);
        in_stack_fffffffffffffcb8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcb8);
        bVar2 = bVar1 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      HomomorphismParams::HomomorphismParams
                ((HomomorphismParams *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                );
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14cb68);
      std::shared_ptr<gss::Timeout>::operator=
                (&in_stack_fffffffffffffca0->timeout,
                 (shared_ptr<gss::Timeout> *)in_stack_fffffffffffffc98);
      std::
      unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    *)0x14cb82);
      std::make_unique<gss::NoRestartsSchedule>();
      std::unique_ptr<gss::RestartsSchedule,std::default_delete<gss::RestartsSchedule>>::operator=
                ((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                  *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
      ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                   *)in_stack_fffffffffffffca0);
      if (1 < in_stack_00000008) {
        std::
        function<bool(std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&)>
        ::operator=((function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                     *)this_01,
                    (anon_class_16_2_16add72f *)
                    CONCAT17(in_stack_fffffffffffffcbf,
                             CONCAT16(bVar3,CONCAT15(in_stack_fffffffffffffcbd,
                                                     CONCAT14(bVar2,in_stack_fffffffffffffcb8)))));
      }
      in_stack_fffffffffffffcb4 = local_dc;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(local_dc,in_stack_fffffffffffffcb0),
                 (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      l._M_len._4_1_ = bVar2;
      l._M_len._0_4_ = in_stack_fffffffffffffcb8;
      l._M_len._5_1_ = in_stack_fffffffffffffcbd;
      l._M_len._6_1_ = bVar3;
      l._M_len._7_1_ = in_stack_fffffffffffffcbf;
      l._M_str = (char *)this_01;
      InputGraph::set_vertex_label
                ((InputGraph *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcac,l);
      in_stack_fffffffffffffcb0 = local_e0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,local_e0),
                 (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      l_00._M_len._4_1_ = bVar2;
      l_00._M_len._0_4_ = in_stack_fffffffffffffcb8;
      l_00._M_len._5_1_ = in_stack_fffffffffffffcbd;
      l_00._M_len._6_1_ = bVar3;
      l_00._M_len._7_1_ = in_stack_fffffffffffffcbf;
      l_00._M_str = (char *)this_01;
      InputGraph::set_vertex_label
                ((InputGraph *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcac,l_00);
      solve_homomorphism_problem(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
      if (in_stack_00000008 < 2) {
        bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                empty((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      0x14cd41);
        if (!bVar1) goto LAB_0014cd49;
      }
      else if (in_stack_00000008 < 1) {
LAB_0014cd49:
        std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                  ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                   in_RSI,(ulong)(local_dc * *(int *)(in_RDI + 8) + *(int *)&in_RCX->_data));
        SVOBitset::set(this_01,CONCAT13(in_stack_fffffffffffffcbf,
                                        CONCAT12(bVar3,CONCAT11(in_stack_fffffffffffffcbd,bVar2))));
        std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                  ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                   in_RSI,(ulong)(local_e0 * *(int *)(in_RDI + 8) + *(int *)&in_RCX->_data));
        SVOBitset::set(this_01,CONCAT13(in_stack_fffffffffffffcbf,
                                        CONCAT12(bVar3,CONCAT11(in_stack_fffffffffffffcbd,bVar2))));
      }
      in_stack_fffffffffffffcac = local_dc;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (char *)CONCAT44(local_dc,in_stack_fffffffffffffca8));
      l_01._M_len._4_1_ = bVar2;
      l_01._M_len._0_4_ = in_stack_fffffffffffffcb8;
      l_01._M_len._5_1_ = in_stack_fffffffffffffcbd;
      l_01._M_len._6_1_ = bVar3;
      l_01._M_len._7_1_ = in_stack_fffffffffffffcbf;
      l_01._M_str = (char *)this_01;
      InputGraph::set_vertex_label
                ((InputGraph *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcac,l_01);
      in_stack_fffffffffffffca8 = local_e0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (char *)CONCAT44(in_stack_fffffffffffffcac,local_e0));
      l_02._M_len._4_1_ = bVar2;
      l_02._M_len._0_4_ = in_stack_fffffffffffffcb8;
      l_02._M_len._5_1_ = in_stack_fffffffffffffcbd;
      l_02._M_len._6_1_ = bVar3;
      l_02._M_len._7_1_ = in_stack_fffffffffffffcbf;
      l_02._M_str = (char *)this_01;
      InputGraph::set_vertex_label
                ((InputGraph *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 in_stack_fffffffffffffcac,l_02);
      HomomorphismResult::~HomomorphismResult((HomomorphismResult *)in_stack_fffffffffffffca0);
      HomomorphismParams::~HomomorphismParams(in_stack_fffffffffffffca0);
      local_e0 = local_e0 + 1;
    }
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

auto HomomorphismModel::_build_extra_shape(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, InputGraph & shape,
    bool injective, int count, bool pattern) -> void
{
    InputGraph master_graph(size, true, false);

    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w))
                master_graph.add_edge(v, w);
        }
    }

    for (unsigned v = 0; v < size && ! _imp->params.timeout->should_abort(); ++v) {
        for (unsigned w = 0; w < v && ! _imp->params.timeout->should_abort(); ++w) {
            HomomorphismParams child_params;
            child_params.timeout = _imp->params.timeout;
            child_params.start_time = _imp->params.start_time;
            child_params.induced = false;
            child_params.restarts_schedule = make_unique<NoRestartsSchedule>();
            child_params.clique_detection = false;
            child_params.injectivity = injective ? Injectivity::Injective : Injectivity::NonInjective;
            child_params.no_supplementals = true;

            int seen_count = 0;
            if (count > 1) {
                child_params.count_solutions = true;
                child_params.enumerate_callback = [&](const VertexToVertexMapping &) {
                    return ++seen_count < count;
                };
            }

            master_graph.set_vertex_label(v, "from");
            master_graph.set_vertex_label(w, "to");
            auto child_result = solve_homomorphism_problem(shape, master_graph, child_params);
            if ((count > 1) ? seen_count >= count : ! child_result.mapping.empty()) {
                graph_rows[v * max_graphs + idx].set(w);
                graph_rows[w * max_graphs + idx].set(v);
            }
            master_graph.set_vertex_label(v, "");
            master_graph.set_vertex_label(w, "");
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("extra_shape");
    ++idx;
}